

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapFieldsImpl<false>
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  ReflectionSchema *this_00;
  MessageFactory *pMVar1;
  pointer ppFVar2;
  FieldDescriptor *field;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar8;
  iterator iVar9;
  OneofDescriptor *oneof_descriptor;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  pointer ppFVar10;
  int oneof_index;
  Message *local_80;
  Reflection *local_78;
  MessageLite *local_70;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  
  if (message1 != message2) {
    local_80 = message2;
    (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d1);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"First argument to SwapFields() (of type \"")
      ;
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,(string *)(*(long *)(CONCAT44(extraout_var,iVar4) + 8) + 0x20));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    (*(local_80->super_MessageLite)._vptr_MessageLite[0x11])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d9);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,"Second argument to SwapFields() (of type \"");
      iVar4 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x11])();
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,(string *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 8) + 0x20));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar1 = this->message_factory_;
    local_78 = this;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    iVar4 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,CONCAT44(extraout_var_01,iVar4));
    local_70 = (MessageLite *)CONCAT44(extraout_var_02,iVar4);
    ppFVar2 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    this_00 = &local_78->schema_;
    for (ppFVar10 = (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppFVar10 != ppFVar2;
        ppFVar10 = ppFVar10 + 1) {
      field = *ppFVar10;
      if (((byte)field[1] & 8) == 0) {
        bVar3 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (bVar3) {
          if (((byte)field[1] & 0x10) == 0) {
            lVar8 = 0;
          }
          else {
            lVar8 = *(long *)(field + 0x28);
          }
          oneof_index = (int)((lVar8 - *(long *)(*(long *)(lVar8 + 0x10) + 0x30)) / 0x28);
          iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&swapped_oneof._M_t,&oneof_index);
          if ((_Rb_tree_header *)iVar9._M_node == &swapped_oneof._M_t._M_impl.super__Rb_tree_header)
          {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &swapped_oneof,&oneof_index);
            if (((byte)field[1] & 0x10) == 0) {
              oneof_descriptor = (OneofDescriptor *)0x0;
            }
            else {
              oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
            }
            SwapOneofField<false>(local_78,message1,local_80,oneof_descriptor);
          }
        }
        else {
          SwapField(local_78,message1,local_80,field);
          if ((~(byte)field[1] & 0x60) != 0) {
            SwapBit(local_78,message1,local_80,field);
          }
        }
      }
      else {
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        internal::ExtensionSet::SwapExtension
                  ((ExtensionSet *)
                   ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),local_70,
                   (ExtensionSet *)
                   ((long)&(local_80->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                   *(int *)(field + 4));
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&swapped_oneof._M_t);
  }
  return;
}

Assistant:

void Reflection::SwapFieldsImpl(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  GOOGLE_DCHECK(!unsafe_shallow_swap || message1->GetArenaForAllocation() ==
                                     message2->GetArenaForAllocation());

  const Message* prototype =
      message_factory_->GetPrototype(message1->GetDescriptor());
  for (const auto* field : fields) {
    CheckInvalidAccess(schema_, field);
    if (field->is_extension()) {
      if (unsafe_shallow_swap) {
        MutableExtensionSet(message1)->UnsafeShallowSwapExtension(
            MutableExtensionSet(message2), field->number());
      } else {
        MutableExtensionSet(message1)->SwapExtension(
            prototype, MutableExtensionSet(message2), field->number());
      }
    } else {
      if (schema_.InRealOneof(field)) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField<unsafe_shallow_swap>(message1, message2,
                                            field->containing_oneof());
      } else {
        // Swap field.
        if (unsafe_shallow_swap) {
          UnsafeShallowSwapField(message1, message2, field);
        } else {
          SwapField(message1, message2, field);
        }
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already. This has to be done after SwapField, because SwapField
        // may depend on the information in has bits.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
      }
    }
  }
}